

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_direct_state_access(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_direct_state_access != 0) {
    glad_glMatrixLoadfEXT = (PFNGLMATRIXLOADFEXTPROC)(*load)("glMatrixLoadfEXT");
    glad_glMatrixLoaddEXT = (PFNGLMATRIXLOADDEXTPROC)(*load)("glMatrixLoaddEXT");
    glad_glMatrixMultfEXT = (PFNGLMATRIXMULTFEXTPROC)(*load)("glMatrixMultfEXT");
    glad_glMatrixMultdEXT = (PFNGLMATRIXMULTDEXTPROC)(*load)("glMatrixMultdEXT");
    glad_glMatrixLoadIdentityEXT =
         (PFNGLMATRIXLOADIDENTITYEXTPROC)(*load)("glMatrixLoadIdentityEXT");
    glad_glMatrixRotatefEXT = (PFNGLMATRIXROTATEFEXTPROC)(*load)("glMatrixRotatefEXT");
    glad_glMatrixRotatedEXT = (PFNGLMATRIXROTATEDEXTPROC)(*load)("glMatrixRotatedEXT");
    glad_glMatrixScalefEXT = (PFNGLMATRIXSCALEFEXTPROC)(*load)("glMatrixScalefEXT");
    glad_glMatrixScaledEXT = (PFNGLMATRIXSCALEDEXTPROC)(*load)("glMatrixScaledEXT");
    glad_glMatrixTranslatefEXT = (PFNGLMATRIXTRANSLATEFEXTPROC)(*load)("glMatrixTranslatefEXT");
    glad_glMatrixTranslatedEXT = (PFNGLMATRIXTRANSLATEDEXTPROC)(*load)("glMatrixTranslatedEXT");
    glad_glMatrixFrustumEXT = (PFNGLMATRIXFRUSTUMEXTPROC)(*load)("glMatrixFrustumEXT");
    glad_glMatrixOrthoEXT = (PFNGLMATRIXORTHOEXTPROC)(*load)("glMatrixOrthoEXT");
    glad_glMatrixPopEXT = (PFNGLMATRIXPOPEXTPROC)(*load)("glMatrixPopEXT");
    glad_glMatrixPushEXT = (PFNGLMATRIXPUSHEXTPROC)(*load)("glMatrixPushEXT");
    glad_glClientAttribDefaultEXT =
         (PFNGLCLIENTATTRIBDEFAULTEXTPROC)(*load)("glClientAttribDefaultEXT");
    glad_glPushClientAttribDefaultEXT =
         (PFNGLPUSHCLIENTATTRIBDEFAULTEXTPROC)(*load)("glPushClientAttribDefaultEXT");
    glad_glTextureParameterfEXT = (PFNGLTEXTUREPARAMETERFEXTPROC)(*load)("glTextureParameterfEXT");
    glad_glTextureParameterfvEXT =
         (PFNGLTEXTUREPARAMETERFVEXTPROC)(*load)("glTextureParameterfvEXT");
    glad_glTextureParameteriEXT = (PFNGLTEXTUREPARAMETERIEXTPROC)(*load)("glTextureParameteriEXT");
    glad_glTextureParameterivEXT =
         (PFNGLTEXTUREPARAMETERIVEXTPROC)(*load)("glTextureParameterivEXT");
    glad_glTextureImage1DEXT = (PFNGLTEXTUREIMAGE1DEXTPROC)(*load)("glTextureImage1DEXT");
    glad_glTextureImage2DEXT = (PFNGLTEXTUREIMAGE2DEXTPROC)(*load)("glTextureImage2DEXT");
    glad_glTextureSubImage1DEXT = (PFNGLTEXTURESUBIMAGE1DEXTPROC)(*load)("glTextureSubImage1DEXT");
    glad_glTextureSubImage2DEXT = (PFNGLTEXTURESUBIMAGE2DEXTPROC)(*load)("glTextureSubImage2DEXT");
    glad_glCopyTextureImage1DEXT =
         (PFNGLCOPYTEXTUREIMAGE1DEXTPROC)(*load)("glCopyTextureImage1DEXT");
    glad_glCopyTextureImage2DEXT =
         (PFNGLCOPYTEXTUREIMAGE2DEXTPROC)(*load)("glCopyTextureImage2DEXT");
    glad_glCopyTextureSubImage1DEXT =
         (PFNGLCOPYTEXTURESUBIMAGE1DEXTPROC)(*load)("glCopyTextureSubImage1DEXT");
    glad_glCopyTextureSubImage2DEXT =
         (PFNGLCOPYTEXTURESUBIMAGE2DEXTPROC)(*load)("glCopyTextureSubImage2DEXT");
    glad_glGetTextureImageEXT = (PFNGLGETTEXTUREIMAGEEXTPROC)(*load)("glGetTextureImageEXT");
    glad_glGetTextureParameterfvEXT =
         (PFNGLGETTEXTUREPARAMETERFVEXTPROC)(*load)("glGetTextureParameterfvEXT");
    glad_glGetTextureParameterivEXT =
         (PFNGLGETTEXTUREPARAMETERIVEXTPROC)(*load)("glGetTextureParameterivEXT");
    glad_glGetTextureLevelParameterfvEXT =
         (PFNGLGETTEXTURELEVELPARAMETERFVEXTPROC)(*load)("glGetTextureLevelParameterfvEXT");
    glad_glGetTextureLevelParameterivEXT =
         (PFNGLGETTEXTURELEVELPARAMETERIVEXTPROC)(*load)("glGetTextureLevelParameterivEXT");
    glad_glTextureImage3DEXT = (PFNGLTEXTUREIMAGE3DEXTPROC)(*load)("glTextureImage3DEXT");
    glad_glTextureSubImage3DEXT = (PFNGLTEXTURESUBIMAGE3DEXTPROC)(*load)("glTextureSubImage3DEXT");
    glad_glCopyTextureSubImage3DEXT =
         (PFNGLCOPYTEXTURESUBIMAGE3DEXTPROC)(*load)("glCopyTextureSubImage3DEXT");
    glad_glBindMultiTextureEXT = (PFNGLBINDMULTITEXTUREEXTPROC)(*load)("glBindMultiTextureEXT");
    glad_glMultiTexCoordPointerEXT =
         (PFNGLMULTITEXCOORDPOINTEREXTPROC)(*load)("glMultiTexCoordPointerEXT");
    glad_glMultiTexEnvfEXT = (PFNGLMULTITEXENVFEXTPROC)(*load)("glMultiTexEnvfEXT");
    glad_glMultiTexEnvfvEXT = (PFNGLMULTITEXENVFVEXTPROC)(*load)("glMultiTexEnvfvEXT");
    glad_glMultiTexEnviEXT = (PFNGLMULTITEXENVIEXTPROC)(*load)("glMultiTexEnviEXT");
    glad_glMultiTexEnvivEXT = (PFNGLMULTITEXENVIVEXTPROC)(*load)("glMultiTexEnvivEXT");
    glad_glMultiTexGendEXT = (PFNGLMULTITEXGENDEXTPROC)(*load)("glMultiTexGendEXT");
    glad_glMultiTexGendvEXT = (PFNGLMULTITEXGENDVEXTPROC)(*load)("glMultiTexGendvEXT");
    glad_glMultiTexGenfEXT = (PFNGLMULTITEXGENFEXTPROC)(*load)("glMultiTexGenfEXT");
    glad_glMultiTexGenfvEXT = (PFNGLMULTITEXGENFVEXTPROC)(*load)("glMultiTexGenfvEXT");
    glad_glMultiTexGeniEXT = (PFNGLMULTITEXGENIEXTPROC)(*load)("glMultiTexGeniEXT");
    glad_glMultiTexGenivEXT = (PFNGLMULTITEXGENIVEXTPROC)(*load)("glMultiTexGenivEXT");
    glad_glGetMultiTexEnvfvEXT = (PFNGLGETMULTITEXENVFVEXTPROC)(*load)("glGetMultiTexEnvfvEXT");
    glad_glGetMultiTexEnvivEXT = (PFNGLGETMULTITEXENVIVEXTPROC)(*load)("glGetMultiTexEnvivEXT");
    glad_glGetMultiTexGendvEXT = (PFNGLGETMULTITEXGENDVEXTPROC)(*load)("glGetMultiTexGendvEXT");
    glad_glGetMultiTexGenfvEXT = (PFNGLGETMULTITEXGENFVEXTPROC)(*load)("glGetMultiTexGenfvEXT");
    glad_glGetMultiTexGenivEXT = (PFNGLGETMULTITEXGENIVEXTPROC)(*load)("glGetMultiTexGenivEXT");
    glad_glMultiTexParameteriEXT =
         (PFNGLMULTITEXPARAMETERIEXTPROC)(*load)("glMultiTexParameteriEXT");
    glad_glMultiTexParameterivEXT =
         (PFNGLMULTITEXPARAMETERIVEXTPROC)(*load)("glMultiTexParameterivEXT");
    glad_glMultiTexParameterfEXT =
         (PFNGLMULTITEXPARAMETERFEXTPROC)(*load)("glMultiTexParameterfEXT");
    glad_glMultiTexParameterfvEXT =
         (PFNGLMULTITEXPARAMETERFVEXTPROC)(*load)("glMultiTexParameterfvEXT");
    glad_glMultiTexImage1DEXT = (PFNGLMULTITEXIMAGE1DEXTPROC)(*load)("glMultiTexImage1DEXT");
    glad_glMultiTexImage2DEXT = (PFNGLMULTITEXIMAGE2DEXTPROC)(*load)("glMultiTexImage2DEXT");
    glad_glMultiTexSubImage1DEXT =
         (PFNGLMULTITEXSUBIMAGE1DEXTPROC)(*load)("glMultiTexSubImage1DEXT");
    glad_glMultiTexSubImage2DEXT =
         (PFNGLMULTITEXSUBIMAGE2DEXTPROC)(*load)("glMultiTexSubImage2DEXT");
    glad_glCopyMultiTexImage1DEXT =
         (PFNGLCOPYMULTITEXIMAGE1DEXTPROC)(*load)("glCopyMultiTexImage1DEXT");
    glad_glCopyMultiTexImage2DEXT =
         (PFNGLCOPYMULTITEXIMAGE2DEXTPROC)(*load)("glCopyMultiTexImage2DEXT");
    glad_glCopyMultiTexSubImage1DEXT =
         (PFNGLCOPYMULTITEXSUBIMAGE1DEXTPROC)(*load)("glCopyMultiTexSubImage1DEXT");
    glad_glCopyMultiTexSubImage2DEXT =
         (PFNGLCOPYMULTITEXSUBIMAGE2DEXTPROC)(*load)("glCopyMultiTexSubImage2DEXT");
    glad_glGetMultiTexImageEXT = (PFNGLGETMULTITEXIMAGEEXTPROC)(*load)("glGetMultiTexImageEXT");
    glad_glGetMultiTexParameterfvEXT =
         (PFNGLGETMULTITEXPARAMETERFVEXTPROC)(*load)("glGetMultiTexParameterfvEXT");
    glad_glGetMultiTexParameterivEXT =
         (PFNGLGETMULTITEXPARAMETERIVEXTPROC)(*load)("glGetMultiTexParameterivEXT");
    glad_glGetMultiTexLevelParameterfvEXT =
         (PFNGLGETMULTITEXLEVELPARAMETERFVEXTPROC)(*load)("glGetMultiTexLevelParameterfvEXT");
    glad_glGetMultiTexLevelParameterivEXT =
         (PFNGLGETMULTITEXLEVELPARAMETERIVEXTPROC)(*load)("glGetMultiTexLevelParameterivEXT");
    glad_glMultiTexImage3DEXT = (PFNGLMULTITEXIMAGE3DEXTPROC)(*load)("glMultiTexImage3DEXT");
    glad_glMultiTexSubImage3DEXT =
         (PFNGLMULTITEXSUBIMAGE3DEXTPROC)(*load)("glMultiTexSubImage3DEXT");
    glad_glCopyMultiTexSubImage3DEXT =
         (PFNGLCOPYMULTITEXSUBIMAGE3DEXTPROC)(*load)("glCopyMultiTexSubImage3DEXT");
    glad_glEnableClientStateIndexedEXT =
         (PFNGLENABLECLIENTSTATEINDEXEDEXTPROC)(*load)("glEnableClientStateIndexedEXT");
    glad_glDisableClientStateIndexedEXT =
         (PFNGLDISABLECLIENTSTATEINDEXEDEXTPROC)(*load)("glDisableClientStateIndexedEXT");
    glad_glGetFloatIndexedvEXT = (PFNGLGETFLOATINDEXEDVEXTPROC)(*load)("glGetFloatIndexedvEXT");
    glad_glGetDoubleIndexedvEXT = (PFNGLGETDOUBLEINDEXEDVEXTPROC)(*load)("glGetDoubleIndexedvEXT");
    glad_glGetPointerIndexedvEXT =
         (PFNGLGETPOINTERINDEXEDVEXTPROC)(*load)("glGetPointerIndexedvEXT");
    glad_glEnableIndexedEXT = (PFNGLENABLEINDEXEDEXTPROC)(*load)("glEnableIndexedEXT");
    glad_glDisableIndexedEXT = (PFNGLDISABLEINDEXEDEXTPROC)(*load)("glDisableIndexedEXT");
    glad_glIsEnabledIndexedEXT = (PFNGLISENABLEDINDEXEDEXTPROC)(*load)("glIsEnabledIndexedEXT");
    glad_glGetIntegerIndexedvEXT =
         (PFNGLGETINTEGERINDEXEDVEXTPROC)(*load)("glGetIntegerIndexedvEXT");
    glad_glGetBooleanIndexedvEXT =
         (PFNGLGETBOOLEANINDEXEDVEXTPROC)(*load)("glGetBooleanIndexedvEXT");
    glad_glCompressedTextureImage3DEXT =
         (PFNGLCOMPRESSEDTEXTUREIMAGE3DEXTPROC)(*load)("glCompressedTextureImage3DEXT");
    glad_glCompressedTextureImage2DEXT =
         (PFNGLCOMPRESSEDTEXTUREIMAGE2DEXTPROC)(*load)("glCompressedTextureImage2DEXT");
    glad_glCompressedTextureImage1DEXT =
         (PFNGLCOMPRESSEDTEXTUREIMAGE1DEXTPROC)(*load)("glCompressedTextureImage1DEXT");
    glad_glCompressedTextureSubImage3DEXT =
         (PFNGLCOMPRESSEDTEXTURESUBIMAGE3DEXTPROC)(*load)("glCompressedTextureSubImage3DEXT");
    glad_glCompressedTextureSubImage2DEXT =
         (PFNGLCOMPRESSEDTEXTURESUBIMAGE2DEXTPROC)(*load)("glCompressedTextureSubImage2DEXT");
    glad_glCompressedTextureSubImage1DEXT =
         (PFNGLCOMPRESSEDTEXTURESUBIMAGE1DEXTPROC)(*load)("glCompressedTextureSubImage1DEXT");
    glad_glGetCompressedTextureImageEXT =
         (PFNGLGETCOMPRESSEDTEXTUREIMAGEEXTPROC)(*load)("glGetCompressedTextureImageEXT");
    glad_glCompressedMultiTexImage3DEXT =
         (PFNGLCOMPRESSEDMULTITEXIMAGE3DEXTPROC)(*load)("glCompressedMultiTexImage3DEXT");
    glad_glCompressedMultiTexImage2DEXT =
         (PFNGLCOMPRESSEDMULTITEXIMAGE2DEXTPROC)(*load)("glCompressedMultiTexImage2DEXT");
    glad_glCompressedMultiTexImage1DEXT =
         (PFNGLCOMPRESSEDMULTITEXIMAGE1DEXTPROC)(*load)("glCompressedMultiTexImage1DEXT");
    glad_glCompressedMultiTexSubImage3DEXT =
         (PFNGLCOMPRESSEDMULTITEXSUBIMAGE3DEXTPROC)(*load)("glCompressedMultiTexSubImage3DEXT");
    glad_glCompressedMultiTexSubImage2DEXT =
         (PFNGLCOMPRESSEDMULTITEXSUBIMAGE2DEXTPROC)(*load)("glCompressedMultiTexSubImage2DEXT");
    glad_glCompressedMultiTexSubImage1DEXT =
         (PFNGLCOMPRESSEDMULTITEXSUBIMAGE1DEXTPROC)(*load)("glCompressedMultiTexSubImage1DEXT");
    glad_glGetCompressedMultiTexImageEXT =
         (PFNGLGETCOMPRESSEDMULTITEXIMAGEEXTPROC)(*load)("glGetCompressedMultiTexImageEXT");
    glad_glMatrixLoadTransposefEXT =
         (PFNGLMATRIXLOADTRANSPOSEFEXTPROC)(*load)("glMatrixLoadTransposefEXT");
    glad_glMatrixLoadTransposedEXT =
         (PFNGLMATRIXLOADTRANSPOSEDEXTPROC)(*load)("glMatrixLoadTransposedEXT");
    glad_glMatrixMultTransposefEXT =
         (PFNGLMATRIXMULTTRANSPOSEFEXTPROC)(*load)("glMatrixMultTransposefEXT");
    glad_glMatrixMultTransposedEXT =
         (PFNGLMATRIXMULTTRANSPOSEDEXTPROC)(*load)("glMatrixMultTransposedEXT");
    glad_glNamedBufferDataEXT = (PFNGLNAMEDBUFFERDATAEXTPROC)(*load)("glNamedBufferDataEXT");
    glad_glNamedBufferSubDataEXT =
         (PFNGLNAMEDBUFFERSUBDATAEXTPROC)(*load)("glNamedBufferSubDataEXT");
    glad_glMapNamedBufferEXT = (PFNGLMAPNAMEDBUFFEREXTPROC)(*load)("glMapNamedBufferEXT");
    glad_glUnmapNamedBufferEXT = (PFNGLUNMAPNAMEDBUFFEREXTPROC)(*load)("glUnmapNamedBufferEXT");
    glad_glGetNamedBufferParameterivEXT =
         (PFNGLGETNAMEDBUFFERPARAMETERIVEXTPROC)(*load)("glGetNamedBufferParameterivEXT");
    glad_glGetNamedBufferPointervEXT =
         (PFNGLGETNAMEDBUFFERPOINTERVEXTPROC)(*load)("glGetNamedBufferPointervEXT");
    glad_glGetNamedBufferSubDataEXT =
         (PFNGLGETNAMEDBUFFERSUBDATAEXTPROC)(*load)("glGetNamedBufferSubDataEXT");
    glad_glProgramUniform1fEXT = (PFNGLPROGRAMUNIFORM1FEXTPROC)(*load)("glProgramUniform1fEXT");
    glad_glProgramUniform2fEXT = (PFNGLPROGRAMUNIFORM2FEXTPROC)(*load)("glProgramUniform2fEXT");
    glad_glProgramUniform3fEXT = (PFNGLPROGRAMUNIFORM3FEXTPROC)(*load)("glProgramUniform3fEXT");
    glad_glProgramUniform4fEXT = (PFNGLPROGRAMUNIFORM4FEXTPROC)(*load)("glProgramUniform4fEXT");
    glad_glProgramUniform1iEXT = (PFNGLPROGRAMUNIFORM1IEXTPROC)(*load)("glProgramUniform1iEXT");
    glad_glProgramUniform2iEXT = (PFNGLPROGRAMUNIFORM2IEXTPROC)(*load)("glProgramUniform2iEXT");
    glad_glProgramUniform3iEXT = (PFNGLPROGRAMUNIFORM3IEXTPROC)(*load)("glProgramUniform3iEXT");
    glad_glProgramUniform4iEXT = (PFNGLPROGRAMUNIFORM4IEXTPROC)(*load)("glProgramUniform4iEXT");
    glad_glProgramUniform1fvEXT = (PFNGLPROGRAMUNIFORM1FVEXTPROC)(*load)("glProgramUniform1fvEXT");
    glad_glProgramUniform2fvEXT = (PFNGLPROGRAMUNIFORM2FVEXTPROC)(*load)("glProgramUniform2fvEXT");
    glad_glProgramUniform3fvEXT = (PFNGLPROGRAMUNIFORM3FVEXTPROC)(*load)("glProgramUniform3fvEXT");
    glad_glProgramUniform4fvEXT = (PFNGLPROGRAMUNIFORM4FVEXTPROC)(*load)("glProgramUniform4fvEXT");
    glad_glProgramUniform1ivEXT = (PFNGLPROGRAMUNIFORM1IVEXTPROC)(*load)("glProgramUniform1ivEXT");
    glad_glProgramUniform2ivEXT = (PFNGLPROGRAMUNIFORM2IVEXTPROC)(*load)("glProgramUniform2ivEXT");
    glad_glProgramUniform3ivEXT = (PFNGLPROGRAMUNIFORM3IVEXTPROC)(*load)("glProgramUniform3ivEXT");
    glad_glProgramUniform4ivEXT = (PFNGLPROGRAMUNIFORM4IVEXTPROC)(*load)("glProgramUniform4ivEXT");
    glad_glProgramUniformMatrix2fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX2FVEXTPROC)(*load)("glProgramUniformMatrix2fvEXT");
    glad_glProgramUniformMatrix3fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX3FVEXTPROC)(*load)("glProgramUniformMatrix3fvEXT");
    glad_glProgramUniformMatrix4fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX4FVEXTPROC)(*load)("glProgramUniformMatrix4fvEXT");
    glad_glProgramUniformMatrix2x3fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX2X3FVEXTPROC)(*load)("glProgramUniformMatrix2x3fvEXT");
    glad_glProgramUniformMatrix3x2fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX3X2FVEXTPROC)(*load)("glProgramUniformMatrix3x2fvEXT");
    glad_glProgramUniformMatrix2x4fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX2X4FVEXTPROC)(*load)("glProgramUniformMatrix2x4fvEXT");
    glad_glProgramUniformMatrix4x2fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX4X2FVEXTPROC)(*load)("glProgramUniformMatrix4x2fvEXT");
    glad_glProgramUniformMatrix3x4fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX3X4FVEXTPROC)(*load)("glProgramUniformMatrix3x4fvEXT");
    glad_glProgramUniformMatrix4x3fvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX4X3FVEXTPROC)(*load)("glProgramUniformMatrix4x3fvEXT");
    glad_glTextureBufferEXT = (PFNGLTEXTUREBUFFEREXTPROC)(*load)("glTextureBufferEXT");
    glad_glMultiTexBufferEXT = (PFNGLMULTITEXBUFFEREXTPROC)(*load)("glMultiTexBufferEXT");
    glad_glTextureParameterIivEXT =
         (PFNGLTEXTUREPARAMETERIIVEXTPROC)(*load)("glTextureParameterIivEXT");
    glad_glTextureParameterIuivEXT =
         (PFNGLTEXTUREPARAMETERIUIVEXTPROC)(*load)("glTextureParameterIuivEXT");
    glad_glGetTextureParameterIivEXT =
         (PFNGLGETTEXTUREPARAMETERIIVEXTPROC)(*load)("glGetTextureParameterIivEXT");
    glad_glGetTextureParameterIuivEXT =
         (PFNGLGETTEXTUREPARAMETERIUIVEXTPROC)(*load)("glGetTextureParameterIuivEXT");
    glad_glMultiTexParameterIivEXT =
         (PFNGLMULTITEXPARAMETERIIVEXTPROC)(*load)("glMultiTexParameterIivEXT");
    glad_glMultiTexParameterIuivEXT =
         (PFNGLMULTITEXPARAMETERIUIVEXTPROC)(*load)("glMultiTexParameterIuivEXT");
    glad_glGetMultiTexParameterIivEXT =
         (PFNGLGETMULTITEXPARAMETERIIVEXTPROC)(*load)("glGetMultiTexParameterIivEXT");
    glad_glGetMultiTexParameterIuivEXT =
         (PFNGLGETMULTITEXPARAMETERIUIVEXTPROC)(*load)("glGetMultiTexParameterIuivEXT");
    glad_glProgramUniform1uiEXT = (PFNGLPROGRAMUNIFORM1UIEXTPROC)(*load)("glProgramUniform1uiEXT");
    glad_glProgramUniform2uiEXT = (PFNGLPROGRAMUNIFORM2UIEXTPROC)(*load)("glProgramUniform2uiEXT");
    glad_glProgramUniform3uiEXT = (PFNGLPROGRAMUNIFORM3UIEXTPROC)(*load)("glProgramUniform3uiEXT");
    glad_glProgramUniform4uiEXT = (PFNGLPROGRAMUNIFORM4UIEXTPROC)(*load)("glProgramUniform4uiEXT");
    glad_glProgramUniform1uivEXT =
         (PFNGLPROGRAMUNIFORM1UIVEXTPROC)(*load)("glProgramUniform1uivEXT");
    glad_glProgramUniform2uivEXT =
         (PFNGLPROGRAMUNIFORM2UIVEXTPROC)(*load)("glProgramUniform2uivEXT");
    glad_glProgramUniform3uivEXT =
         (PFNGLPROGRAMUNIFORM3UIVEXTPROC)(*load)("glProgramUniform3uivEXT");
    glad_glProgramUniform4uivEXT =
         (PFNGLPROGRAMUNIFORM4UIVEXTPROC)(*load)("glProgramUniform4uivEXT");
    glad_glNamedProgramLocalParameters4fvEXT =
         (PFNGLNAMEDPROGRAMLOCALPARAMETERS4FVEXTPROC)(*load)("glNamedProgramLocalParameters4fvEXT");
    glad_glNamedProgramLocalParameterI4iEXT =
         (PFNGLNAMEDPROGRAMLOCALPARAMETERI4IEXTPROC)(*load)("glNamedProgramLocalParameterI4iEXT");
    glad_glNamedProgramLocalParameterI4ivEXT =
         (PFNGLNAMEDPROGRAMLOCALPARAMETERI4IVEXTPROC)(*load)("glNamedProgramLocalParameterI4ivEXT");
    glad_glNamedProgramLocalParametersI4ivEXT =
         (PFNGLNAMEDPROGRAMLOCALPARAMETERSI4IVEXTPROC)
         (*load)("glNamedProgramLocalParametersI4ivEXT");
    glad_glNamedProgramLocalParameterI4uiEXT =
         (PFNGLNAMEDPROGRAMLOCALPARAMETERI4UIEXTPROC)(*load)("glNamedProgramLocalParameterI4uiEXT");
    glad_glNamedProgramLocalParameterI4uivEXT =
         (PFNGLNAMEDPROGRAMLOCALPARAMETERI4UIVEXTPROC)
         (*load)("glNamedProgramLocalParameterI4uivEXT");
    glad_glNamedProgramLocalParametersI4uivEXT =
         (PFNGLNAMEDPROGRAMLOCALPARAMETERSI4UIVEXTPROC)
         (*load)("glNamedProgramLocalParametersI4uivEXT");
    glad_glGetNamedProgramLocalParameterIivEXT =
         (PFNGLGETNAMEDPROGRAMLOCALPARAMETERIIVEXTPROC)
         (*load)("glGetNamedProgramLocalParameterIivEXT");
    glad_glGetNamedProgramLocalParameterIuivEXT =
         (PFNGLGETNAMEDPROGRAMLOCALPARAMETERIUIVEXTPROC)
         (*load)("glGetNamedProgramLocalParameterIuivEXT");
    glad_glEnableClientStateiEXT =
         (PFNGLENABLECLIENTSTATEIEXTPROC)(*load)("glEnableClientStateiEXT");
    glad_glDisableClientStateiEXT =
         (PFNGLDISABLECLIENTSTATEIEXTPROC)(*load)("glDisableClientStateiEXT");
    glad_glGetFloati_vEXT = (PFNGLGETFLOATI_VEXTPROC)(*load)("glGetFloati_vEXT");
    glad_glGetDoublei_vEXT = (PFNGLGETDOUBLEI_VEXTPROC)(*load)("glGetDoublei_vEXT");
    glad_glGetPointeri_vEXT = (PFNGLGETPOINTERI_VEXTPROC)(*load)("glGetPointeri_vEXT");
    glad_glNamedProgramStringEXT =
         (PFNGLNAMEDPROGRAMSTRINGEXTPROC)(*load)("glNamedProgramStringEXT");
    glad_glNamedProgramLocalParameter4dEXT =
         (PFNGLNAMEDPROGRAMLOCALPARAMETER4DEXTPROC)(*load)("glNamedProgramLocalParameter4dEXT");
    glad_glNamedProgramLocalParameter4dvEXT =
         (PFNGLNAMEDPROGRAMLOCALPARAMETER4DVEXTPROC)(*load)("glNamedProgramLocalParameter4dvEXT");
    glad_glNamedProgramLocalParameter4fEXT =
         (PFNGLNAMEDPROGRAMLOCALPARAMETER4FEXTPROC)(*load)("glNamedProgramLocalParameter4fEXT");
    glad_glNamedProgramLocalParameter4fvEXT =
         (PFNGLNAMEDPROGRAMLOCALPARAMETER4FVEXTPROC)(*load)("glNamedProgramLocalParameter4fvEXT");
    glad_glGetNamedProgramLocalParameterdvEXT =
         (PFNGLGETNAMEDPROGRAMLOCALPARAMETERDVEXTPROC)
         (*load)("glGetNamedProgramLocalParameterdvEXT");
    glad_glGetNamedProgramLocalParameterfvEXT =
         (PFNGLGETNAMEDPROGRAMLOCALPARAMETERFVEXTPROC)
         (*load)("glGetNamedProgramLocalParameterfvEXT");
    glad_glGetNamedProgramivEXT = (PFNGLGETNAMEDPROGRAMIVEXTPROC)(*load)("glGetNamedProgramivEXT");
    glad_glGetNamedProgramStringEXT =
         (PFNGLGETNAMEDPROGRAMSTRINGEXTPROC)(*load)("glGetNamedProgramStringEXT");
    glad_glNamedRenderbufferStorageEXT =
         (PFNGLNAMEDRENDERBUFFERSTORAGEEXTPROC)(*load)("glNamedRenderbufferStorageEXT");
    glad_glGetNamedRenderbufferParameterivEXT =
         (PFNGLGETNAMEDRENDERBUFFERPARAMETERIVEXTPROC)
         (*load)("glGetNamedRenderbufferParameterivEXT");
    glad_glNamedRenderbufferStorageMultisampleEXT =
         (PFNGLNAMEDRENDERBUFFERSTORAGEMULTISAMPLEEXTPROC)
         (*load)("glNamedRenderbufferStorageMultisampleEXT");
    glad_glNamedRenderbufferStorageMultisampleCoverageEXT =
         (PFNGLNAMEDRENDERBUFFERSTORAGEMULTISAMPLECOVERAGEEXTPROC)
         (*load)("glNamedRenderbufferStorageMultisampleCoverageEXT");
    glad_glCheckNamedFramebufferStatusEXT =
         (PFNGLCHECKNAMEDFRAMEBUFFERSTATUSEXTPROC)(*load)("glCheckNamedFramebufferStatusEXT");
    glad_glNamedFramebufferTexture1DEXT =
         (PFNGLNAMEDFRAMEBUFFERTEXTURE1DEXTPROC)(*load)("glNamedFramebufferTexture1DEXT");
    glad_glNamedFramebufferTexture2DEXT =
         (PFNGLNAMEDFRAMEBUFFERTEXTURE2DEXTPROC)(*load)("glNamedFramebufferTexture2DEXT");
    glad_glNamedFramebufferTexture3DEXT =
         (PFNGLNAMEDFRAMEBUFFERTEXTURE3DEXTPROC)(*load)("glNamedFramebufferTexture3DEXT");
    glad_glNamedFramebufferRenderbufferEXT =
         (PFNGLNAMEDFRAMEBUFFERRENDERBUFFEREXTPROC)(*load)("glNamedFramebufferRenderbufferEXT");
    glad_glGetNamedFramebufferAttachmentParameterivEXT =
         (PFNGLGETNAMEDFRAMEBUFFERATTACHMENTPARAMETERIVEXTPROC)
         (*load)("glGetNamedFramebufferAttachmentParameterivEXT");
    glad_glGenerateTextureMipmapEXT =
         (PFNGLGENERATETEXTUREMIPMAPEXTPROC)(*load)("glGenerateTextureMipmapEXT");
    glad_glGenerateMultiTexMipmapEXT =
         (PFNGLGENERATEMULTITEXMIPMAPEXTPROC)(*load)("glGenerateMultiTexMipmapEXT");
    glad_glFramebufferDrawBufferEXT =
         (PFNGLFRAMEBUFFERDRAWBUFFEREXTPROC)(*load)("glFramebufferDrawBufferEXT");
    glad_glFramebufferDrawBuffersEXT =
         (PFNGLFRAMEBUFFERDRAWBUFFERSEXTPROC)(*load)("glFramebufferDrawBuffersEXT");
    glad_glFramebufferReadBufferEXT =
         (PFNGLFRAMEBUFFERREADBUFFEREXTPROC)(*load)("glFramebufferReadBufferEXT");
    glad_glGetFramebufferParameterivEXT =
         (PFNGLGETFRAMEBUFFERPARAMETERIVEXTPROC)(*load)("glGetFramebufferParameterivEXT");
    glad_glNamedCopyBufferSubDataEXT =
         (PFNGLNAMEDCOPYBUFFERSUBDATAEXTPROC)(*load)("glNamedCopyBufferSubDataEXT");
    glad_glNamedFramebufferTextureEXT =
         (PFNGLNAMEDFRAMEBUFFERTEXTUREEXTPROC)(*load)("glNamedFramebufferTextureEXT");
    glad_glNamedFramebufferTextureLayerEXT =
         (PFNGLNAMEDFRAMEBUFFERTEXTURELAYEREXTPROC)(*load)("glNamedFramebufferTextureLayerEXT");
    glad_glNamedFramebufferTextureFaceEXT =
         (PFNGLNAMEDFRAMEBUFFERTEXTUREFACEEXTPROC)(*load)("glNamedFramebufferTextureFaceEXT");
    glad_glTextureRenderbufferEXT =
         (PFNGLTEXTURERENDERBUFFEREXTPROC)(*load)("glTextureRenderbufferEXT");
    glad_glMultiTexRenderbufferEXT =
         (PFNGLMULTITEXRENDERBUFFEREXTPROC)(*load)("glMultiTexRenderbufferEXT");
    glad_glVertexArrayVertexOffsetEXT =
         (PFNGLVERTEXARRAYVERTEXOFFSETEXTPROC)(*load)("glVertexArrayVertexOffsetEXT");
    glad_glVertexArrayColorOffsetEXT =
         (PFNGLVERTEXARRAYCOLOROFFSETEXTPROC)(*load)("glVertexArrayColorOffsetEXT");
    glad_glVertexArrayEdgeFlagOffsetEXT =
         (PFNGLVERTEXARRAYEDGEFLAGOFFSETEXTPROC)(*load)("glVertexArrayEdgeFlagOffsetEXT");
    glad_glVertexArrayIndexOffsetEXT =
         (PFNGLVERTEXARRAYINDEXOFFSETEXTPROC)(*load)("glVertexArrayIndexOffsetEXT");
    glad_glVertexArrayNormalOffsetEXT =
         (PFNGLVERTEXARRAYNORMALOFFSETEXTPROC)(*load)("glVertexArrayNormalOffsetEXT");
    glad_glVertexArrayTexCoordOffsetEXT =
         (PFNGLVERTEXARRAYTEXCOORDOFFSETEXTPROC)(*load)("glVertexArrayTexCoordOffsetEXT");
    glad_glVertexArrayMultiTexCoordOffsetEXT =
         (PFNGLVERTEXARRAYMULTITEXCOORDOFFSETEXTPROC)(*load)("glVertexArrayMultiTexCoordOffsetEXT");
    glad_glVertexArrayFogCoordOffsetEXT =
         (PFNGLVERTEXARRAYFOGCOORDOFFSETEXTPROC)(*load)("glVertexArrayFogCoordOffsetEXT");
    glad_glVertexArraySecondaryColorOffsetEXT =
         (PFNGLVERTEXARRAYSECONDARYCOLOROFFSETEXTPROC)
         (*load)("glVertexArraySecondaryColorOffsetEXT");
    glad_glVertexArrayVertexAttribOffsetEXT =
         (PFNGLVERTEXARRAYVERTEXATTRIBOFFSETEXTPROC)(*load)("glVertexArrayVertexAttribOffsetEXT");
    glad_glVertexArrayVertexAttribIOffsetEXT =
         (PFNGLVERTEXARRAYVERTEXATTRIBIOFFSETEXTPROC)(*load)("glVertexArrayVertexAttribIOffsetEXT");
    glad_glEnableVertexArrayEXT = (PFNGLENABLEVERTEXARRAYEXTPROC)(*load)("glEnableVertexArrayEXT");
    glad_glDisableVertexArrayEXT =
         (PFNGLDISABLEVERTEXARRAYEXTPROC)(*load)("glDisableVertexArrayEXT");
    glad_glEnableVertexArrayAttribEXT =
         (PFNGLENABLEVERTEXARRAYATTRIBEXTPROC)(*load)("glEnableVertexArrayAttribEXT");
    glad_glDisableVertexArrayAttribEXT =
         (PFNGLDISABLEVERTEXARRAYATTRIBEXTPROC)(*load)("glDisableVertexArrayAttribEXT");
    glad_glGetVertexArrayIntegervEXT =
         (PFNGLGETVERTEXARRAYINTEGERVEXTPROC)(*load)("glGetVertexArrayIntegervEXT");
    glad_glGetVertexArrayPointervEXT =
         (PFNGLGETVERTEXARRAYPOINTERVEXTPROC)(*load)("glGetVertexArrayPointervEXT");
    glad_glGetVertexArrayIntegeri_vEXT =
         (PFNGLGETVERTEXARRAYINTEGERI_VEXTPROC)(*load)("glGetVertexArrayIntegeri_vEXT");
    glad_glGetVertexArrayPointeri_vEXT =
         (PFNGLGETVERTEXARRAYPOINTERI_VEXTPROC)(*load)("glGetVertexArrayPointeri_vEXT");
    glad_glMapNamedBufferRangeEXT =
         (PFNGLMAPNAMEDBUFFERRANGEEXTPROC)(*load)("glMapNamedBufferRangeEXT");
    glad_glFlushMappedNamedBufferRangeEXT =
         (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGEEXTPROC)(*load)("glFlushMappedNamedBufferRangeEXT");
    glad_glNamedBufferStorageEXT =
         (PFNGLNAMEDBUFFERSTORAGEEXTPROC)(*load)("glNamedBufferStorageEXT");
    glad_glClearNamedBufferDataEXT =
         (PFNGLCLEARNAMEDBUFFERDATAEXTPROC)(*load)("glClearNamedBufferDataEXT");
    glad_glClearNamedBufferSubDataEXT =
         (PFNGLCLEARNAMEDBUFFERSUBDATAEXTPROC)(*load)("glClearNamedBufferSubDataEXT");
    glad_glNamedFramebufferParameteriEXT =
         (PFNGLNAMEDFRAMEBUFFERPARAMETERIEXTPROC)(*load)("glNamedFramebufferParameteriEXT");
    glad_glGetNamedFramebufferParameterivEXT =
         (PFNGLGETNAMEDFRAMEBUFFERPARAMETERIVEXTPROC)(*load)("glGetNamedFramebufferParameterivEXT");
    glad_glProgramUniform1dEXT = (PFNGLPROGRAMUNIFORM1DEXTPROC)(*load)("glProgramUniform1dEXT");
    glad_glProgramUniform2dEXT = (PFNGLPROGRAMUNIFORM2DEXTPROC)(*load)("glProgramUniform2dEXT");
    glad_glProgramUniform3dEXT = (PFNGLPROGRAMUNIFORM3DEXTPROC)(*load)("glProgramUniform3dEXT");
    glad_glProgramUniform4dEXT = (PFNGLPROGRAMUNIFORM4DEXTPROC)(*load)("glProgramUniform4dEXT");
    glad_glProgramUniform1dvEXT = (PFNGLPROGRAMUNIFORM1DVEXTPROC)(*load)("glProgramUniform1dvEXT");
    glad_glProgramUniform2dvEXT = (PFNGLPROGRAMUNIFORM2DVEXTPROC)(*load)("glProgramUniform2dvEXT");
    glad_glProgramUniform3dvEXT = (PFNGLPROGRAMUNIFORM3DVEXTPROC)(*load)("glProgramUniform3dvEXT");
    glad_glProgramUniform4dvEXT = (PFNGLPROGRAMUNIFORM4DVEXTPROC)(*load)("glProgramUniform4dvEXT");
    glad_glProgramUniformMatrix2dvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX2DVEXTPROC)(*load)("glProgramUniformMatrix2dvEXT");
    glad_glProgramUniformMatrix3dvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX3DVEXTPROC)(*load)("glProgramUniformMatrix3dvEXT");
    glad_glProgramUniformMatrix4dvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX4DVEXTPROC)(*load)("glProgramUniformMatrix4dvEXT");
    glad_glProgramUniformMatrix2x3dvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX2X3DVEXTPROC)(*load)("glProgramUniformMatrix2x3dvEXT");
    glad_glProgramUniformMatrix2x4dvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX2X4DVEXTPROC)(*load)("glProgramUniformMatrix2x4dvEXT");
    glad_glProgramUniformMatrix3x2dvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX3X2DVEXTPROC)(*load)("glProgramUniformMatrix3x2dvEXT");
    glad_glProgramUniformMatrix3x4dvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX3X4DVEXTPROC)(*load)("glProgramUniformMatrix3x4dvEXT");
    glad_glProgramUniformMatrix4x2dvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX4X2DVEXTPROC)(*load)("glProgramUniformMatrix4x2dvEXT");
    glad_glProgramUniformMatrix4x3dvEXT =
         (PFNGLPROGRAMUNIFORMMATRIX4X3DVEXTPROC)(*load)("glProgramUniformMatrix4x3dvEXT");
    glad_glTextureBufferRangeEXT =
         (PFNGLTEXTUREBUFFERRANGEEXTPROC)(*load)("glTextureBufferRangeEXT");
    glad_glTextureStorage1DEXT = (PFNGLTEXTURESTORAGE1DEXTPROC)(*load)("glTextureStorage1DEXT");
    glad_glTextureStorage2DEXT = (PFNGLTEXTURESTORAGE2DEXTPROC)(*load)("glTextureStorage2DEXT");
    glad_glTextureStorage3DEXT = (PFNGLTEXTURESTORAGE3DEXTPROC)(*load)("glTextureStorage3DEXT");
    glad_glTextureStorage2DMultisampleEXT =
         (PFNGLTEXTURESTORAGE2DMULTISAMPLEEXTPROC)(*load)("glTextureStorage2DMultisampleEXT");
    glad_glTextureStorage3DMultisampleEXT =
         (PFNGLTEXTURESTORAGE3DMULTISAMPLEEXTPROC)(*load)("glTextureStorage3DMultisampleEXT");
    glad_glVertexArrayBindVertexBufferEXT =
         (PFNGLVERTEXARRAYBINDVERTEXBUFFEREXTPROC)(*load)("glVertexArrayBindVertexBufferEXT");
    glad_glVertexArrayVertexAttribFormatEXT =
         (PFNGLVERTEXARRAYVERTEXATTRIBFORMATEXTPROC)(*load)("glVertexArrayVertexAttribFormatEXT");
    glad_glVertexArrayVertexAttribIFormatEXT =
         (PFNGLVERTEXARRAYVERTEXATTRIBIFORMATEXTPROC)(*load)("glVertexArrayVertexAttribIFormatEXT");
    glad_glVertexArrayVertexAttribLFormatEXT =
         (PFNGLVERTEXARRAYVERTEXATTRIBLFORMATEXTPROC)(*load)("glVertexArrayVertexAttribLFormatEXT");
    glad_glVertexArrayVertexAttribBindingEXT =
         (PFNGLVERTEXARRAYVERTEXATTRIBBINDINGEXTPROC)(*load)("glVertexArrayVertexAttribBindingEXT");
    glad_glVertexArrayVertexBindingDivisorEXT =
         (PFNGLVERTEXARRAYVERTEXBINDINGDIVISOREXTPROC)
         (*load)("glVertexArrayVertexBindingDivisorEXT");
    glad_glVertexArrayVertexAttribLOffsetEXT =
         (PFNGLVERTEXARRAYVERTEXATTRIBLOFFSETEXTPROC)(*load)("glVertexArrayVertexAttribLOffsetEXT");
    glad_glTexturePageCommitmentEXT =
         (PFNGLTEXTUREPAGECOMMITMENTEXTPROC)(*load)("glTexturePageCommitmentEXT");
    glad_glVertexArrayVertexAttribDivisorEXT =
         (PFNGLVERTEXARRAYVERTEXATTRIBDIVISOREXTPROC)(*load)("glVertexArrayVertexAttribDivisorEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_direct_state_access(GLADloadproc load) {
	if(!GLAD_GL_EXT_direct_state_access) return;
	glad_glMatrixLoadfEXT = (PFNGLMATRIXLOADFEXTPROC)load("glMatrixLoadfEXT");
	glad_glMatrixLoaddEXT = (PFNGLMATRIXLOADDEXTPROC)load("glMatrixLoaddEXT");
	glad_glMatrixMultfEXT = (PFNGLMATRIXMULTFEXTPROC)load("glMatrixMultfEXT");
	glad_glMatrixMultdEXT = (PFNGLMATRIXMULTDEXTPROC)load("glMatrixMultdEXT");
	glad_glMatrixLoadIdentityEXT = (PFNGLMATRIXLOADIDENTITYEXTPROC)load("glMatrixLoadIdentityEXT");
	glad_glMatrixRotatefEXT = (PFNGLMATRIXROTATEFEXTPROC)load("glMatrixRotatefEXT");
	glad_glMatrixRotatedEXT = (PFNGLMATRIXROTATEDEXTPROC)load("glMatrixRotatedEXT");
	glad_glMatrixScalefEXT = (PFNGLMATRIXSCALEFEXTPROC)load("glMatrixScalefEXT");
	glad_glMatrixScaledEXT = (PFNGLMATRIXSCALEDEXTPROC)load("glMatrixScaledEXT");
	glad_glMatrixTranslatefEXT = (PFNGLMATRIXTRANSLATEFEXTPROC)load("glMatrixTranslatefEXT");
	glad_glMatrixTranslatedEXT = (PFNGLMATRIXTRANSLATEDEXTPROC)load("glMatrixTranslatedEXT");
	glad_glMatrixFrustumEXT = (PFNGLMATRIXFRUSTUMEXTPROC)load("glMatrixFrustumEXT");
	glad_glMatrixOrthoEXT = (PFNGLMATRIXORTHOEXTPROC)load("glMatrixOrthoEXT");
	glad_glMatrixPopEXT = (PFNGLMATRIXPOPEXTPROC)load("glMatrixPopEXT");
	glad_glMatrixPushEXT = (PFNGLMATRIXPUSHEXTPROC)load("glMatrixPushEXT");
	glad_glClientAttribDefaultEXT = (PFNGLCLIENTATTRIBDEFAULTEXTPROC)load("glClientAttribDefaultEXT");
	glad_glPushClientAttribDefaultEXT = (PFNGLPUSHCLIENTATTRIBDEFAULTEXTPROC)load("glPushClientAttribDefaultEXT");
	glad_glTextureParameterfEXT = (PFNGLTEXTUREPARAMETERFEXTPROC)load("glTextureParameterfEXT");
	glad_glTextureParameterfvEXT = (PFNGLTEXTUREPARAMETERFVEXTPROC)load("glTextureParameterfvEXT");
	glad_glTextureParameteriEXT = (PFNGLTEXTUREPARAMETERIEXTPROC)load("glTextureParameteriEXT");
	glad_glTextureParameterivEXT = (PFNGLTEXTUREPARAMETERIVEXTPROC)load("glTextureParameterivEXT");
	glad_glTextureImage1DEXT = (PFNGLTEXTUREIMAGE1DEXTPROC)load("glTextureImage1DEXT");
	glad_glTextureImage2DEXT = (PFNGLTEXTUREIMAGE2DEXTPROC)load("glTextureImage2DEXT");
	glad_glTextureSubImage1DEXT = (PFNGLTEXTURESUBIMAGE1DEXTPROC)load("glTextureSubImage1DEXT");
	glad_glTextureSubImage2DEXT = (PFNGLTEXTURESUBIMAGE2DEXTPROC)load("glTextureSubImage2DEXT");
	glad_glCopyTextureImage1DEXT = (PFNGLCOPYTEXTUREIMAGE1DEXTPROC)load("glCopyTextureImage1DEXT");
	glad_glCopyTextureImage2DEXT = (PFNGLCOPYTEXTUREIMAGE2DEXTPROC)load("glCopyTextureImage2DEXT");
	glad_glCopyTextureSubImage1DEXT = (PFNGLCOPYTEXTURESUBIMAGE1DEXTPROC)load("glCopyTextureSubImage1DEXT");
	glad_glCopyTextureSubImage2DEXT = (PFNGLCOPYTEXTURESUBIMAGE2DEXTPROC)load("glCopyTextureSubImage2DEXT");
	glad_glGetTextureImageEXT = (PFNGLGETTEXTUREIMAGEEXTPROC)load("glGetTextureImageEXT");
	glad_glGetTextureParameterfvEXT = (PFNGLGETTEXTUREPARAMETERFVEXTPROC)load("glGetTextureParameterfvEXT");
	glad_glGetTextureParameterivEXT = (PFNGLGETTEXTUREPARAMETERIVEXTPROC)load("glGetTextureParameterivEXT");
	glad_glGetTextureLevelParameterfvEXT = (PFNGLGETTEXTURELEVELPARAMETERFVEXTPROC)load("glGetTextureLevelParameterfvEXT");
	glad_glGetTextureLevelParameterivEXT = (PFNGLGETTEXTURELEVELPARAMETERIVEXTPROC)load("glGetTextureLevelParameterivEXT");
	glad_glTextureImage3DEXT = (PFNGLTEXTUREIMAGE3DEXTPROC)load("glTextureImage3DEXT");
	glad_glTextureSubImage3DEXT = (PFNGLTEXTURESUBIMAGE3DEXTPROC)load("glTextureSubImage3DEXT");
	glad_glCopyTextureSubImage3DEXT = (PFNGLCOPYTEXTURESUBIMAGE3DEXTPROC)load("glCopyTextureSubImage3DEXT");
	glad_glBindMultiTextureEXT = (PFNGLBINDMULTITEXTUREEXTPROC)load("glBindMultiTextureEXT");
	glad_glMultiTexCoordPointerEXT = (PFNGLMULTITEXCOORDPOINTEREXTPROC)load("glMultiTexCoordPointerEXT");
	glad_glMultiTexEnvfEXT = (PFNGLMULTITEXENVFEXTPROC)load("glMultiTexEnvfEXT");
	glad_glMultiTexEnvfvEXT = (PFNGLMULTITEXENVFVEXTPROC)load("glMultiTexEnvfvEXT");
	glad_glMultiTexEnviEXT = (PFNGLMULTITEXENVIEXTPROC)load("glMultiTexEnviEXT");
	glad_glMultiTexEnvivEXT = (PFNGLMULTITEXENVIVEXTPROC)load("glMultiTexEnvivEXT");
	glad_glMultiTexGendEXT = (PFNGLMULTITEXGENDEXTPROC)load("glMultiTexGendEXT");
	glad_glMultiTexGendvEXT = (PFNGLMULTITEXGENDVEXTPROC)load("glMultiTexGendvEXT");
	glad_glMultiTexGenfEXT = (PFNGLMULTITEXGENFEXTPROC)load("glMultiTexGenfEXT");
	glad_glMultiTexGenfvEXT = (PFNGLMULTITEXGENFVEXTPROC)load("glMultiTexGenfvEXT");
	glad_glMultiTexGeniEXT = (PFNGLMULTITEXGENIEXTPROC)load("glMultiTexGeniEXT");
	glad_glMultiTexGenivEXT = (PFNGLMULTITEXGENIVEXTPROC)load("glMultiTexGenivEXT");
	glad_glGetMultiTexEnvfvEXT = (PFNGLGETMULTITEXENVFVEXTPROC)load("glGetMultiTexEnvfvEXT");
	glad_glGetMultiTexEnvivEXT = (PFNGLGETMULTITEXENVIVEXTPROC)load("glGetMultiTexEnvivEXT");
	glad_glGetMultiTexGendvEXT = (PFNGLGETMULTITEXGENDVEXTPROC)load("glGetMultiTexGendvEXT");
	glad_glGetMultiTexGenfvEXT = (PFNGLGETMULTITEXGENFVEXTPROC)load("glGetMultiTexGenfvEXT");
	glad_glGetMultiTexGenivEXT = (PFNGLGETMULTITEXGENIVEXTPROC)load("glGetMultiTexGenivEXT");
	glad_glMultiTexParameteriEXT = (PFNGLMULTITEXPARAMETERIEXTPROC)load("glMultiTexParameteriEXT");
	glad_glMultiTexParameterivEXT = (PFNGLMULTITEXPARAMETERIVEXTPROC)load("glMultiTexParameterivEXT");
	glad_glMultiTexParameterfEXT = (PFNGLMULTITEXPARAMETERFEXTPROC)load("glMultiTexParameterfEXT");
	glad_glMultiTexParameterfvEXT = (PFNGLMULTITEXPARAMETERFVEXTPROC)load("glMultiTexParameterfvEXT");
	glad_glMultiTexImage1DEXT = (PFNGLMULTITEXIMAGE1DEXTPROC)load("glMultiTexImage1DEXT");
	glad_glMultiTexImage2DEXT = (PFNGLMULTITEXIMAGE2DEXTPROC)load("glMultiTexImage2DEXT");
	glad_glMultiTexSubImage1DEXT = (PFNGLMULTITEXSUBIMAGE1DEXTPROC)load("glMultiTexSubImage1DEXT");
	glad_glMultiTexSubImage2DEXT = (PFNGLMULTITEXSUBIMAGE2DEXTPROC)load("glMultiTexSubImage2DEXT");
	glad_glCopyMultiTexImage1DEXT = (PFNGLCOPYMULTITEXIMAGE1DEXTPROC)load("glCopyMultiTexImage1DEXT");
	glad_glCopyMultiTexImage2DEXT = (PFNGLCOPYMULTITEXIMAGE2DEXTPROC)load("glCopyMultiTexImage2DEXT");
	glad_glCopyMultiTexSubImage1DEXT = (PFNGLCOPYMULTITEXSUBIMAGE1DEXTPROC)load("glCopyMultiTexSubImage1DEXT");
	glad_glCopyMultiTexSubImage2DEXT = (PFNGLCOPYMULTITEXSUBIMAGE2DEXTPROC)load("glCopyMultiTexSubImage2DEXT");
	glad_glGetMultiTexImageEXT = (PFNGLGETMULTITEXIMAGEEXTPROC)load("glGetMultiTexImageEXT");
	glad_glGetMultiTexParameterfvEXT = (PFNGLGETMULTITEXPARAMETERFVEXTPROC)load("glGetMultiTexParameterfvEXT");
	glad_glGetMultiTexParameterivEXT = (PFNGLGETMULTITEXPARAMETERIVEXTPROC)load("glGetMultiTexParameterivEXT");
	glad_glGetMultiTexLevelParameterfvEXT = (PFNGLGETMULTITEXLEVELPARAMETERFVEXTPROC)load("glGetMultiTexLevelParameterfvEXT");
	glad_glGetMultiTexLevelParameterivEXT = (PFNGLGETMULTITEXLEVELPARAMETERIVEXTPROC)load("glGetMultiTexLevelParameterivEXT");
	glad_glMultiTexImage3DEXT = (PFNGLMULTITEXIMAGE3DEXTPROC)load("glMultiTexImage3DEXT");
	glad_glMultiTexSubImage3DEXT = (PFNGLMULTITEXSUBIMAGE3DEXTPROC)load("glMultiTexSubImage3DEXT");
	glad_glCopyMultiTexSubImage3DEXT = (PFNGLCOPYMULTITEXSUBIMAGE3DEXTPROC)load("glCopyMultiTexSubImage3DEXT");
	glad_glEnableClientStateIndexedEXT = (PFNGLENABLECLIENTSTATEINDEXEDEXTPROC)load("glEnableClientStateIndexedEXT");
	glad_glDisableClientStateIndexedEXT = (PFNGLDISABLECLIENTSTATEINDEXEDEXTPROC)load("glDisableClientStateIndexedEXT");
	glad_glGetFloatIndexedvEXT = (PFNGLGETFLOATINDEXEDVEXTPROC)load("glGetFloatIndexedvEXT");
	glad_glGetDoubleIndexedvEXT = (PFNGLGETDOUBLEINDEXEDVEXTPROC)load("glGetDoubleIndexedvEXT");
	glad_glGetPointerIndexedvEXT = (PFNGLGETPOINTERINDEXEDVEXTPROC)load("glGetPointerIndexedvEXT");
	glad_glEnableIndexedEXT = (PFNGLENABLEINDEXEDEXTPROC)load("glEnableIndexedEXT");
	glad_glDisableIndexedEXT = (PFNGLDISABLEINDEXEDEXTPROC)load("glDisableIndexedEXT");
	glad_glIsEnabledIndexedEXT = (PFNGLISENABLEDINDEXEDEXTPROC)load("glIsEnabledIndexedEXT");
	glad_glGetIntegerIndexedvEXT = (PFNGLGETINTEGERINDEXEDVEXTPROC)load("glGetIntegerIndexedvEXT");
	glad_glGetBooleanIndexedvEXT = (PFNGLGETBOOLEANINDEXEDVEXTPROC)load("glGetBooleanIndexedvEXT");
	glad_glCompressedTextureImage3DEXT = (PFNGLCOMPRESSEDTEXTUREIMAGE3DEXTPROC)load("glCompressedTextureImage3DEXT");
	glad_glCompressedTextureImage2DEXT = (PFNGLCOMPRESSEDTEXTUREIMAGE2DEXTPROC)load("glCompressedTextureImage2DEXT");
	glad_glCompressedTextureImage1DEXT = (PFNGLCOMPRESSEDTEXTUREIMAGE1DEXTPROC)load("glCompressedTextureImage1DEXT");
	glad_glCompressedTextureSubImage3DEXT = (PFNGLCOMPRESSEDTEXTURESUBIMAGE3DEXTPROC)load("glCompressedTextureSubImage3DEXT");
	glad_glCompressedTextureSubImage2DEXT = (PFNGLCOMPRESSEDTEXTURESUBIMAGE2DEXTPROC)load("glCompressedTextureSubImage2DEXT");
	glad_glCompressedTextureSubImage1DEXT = (PFNGLCOMPRESSEDTEXTURESUBIMAGE1DEXTPROC)load("glCompressedTextureSubImage1DEXT");
	glad_glGetCompressedTextureImageEXT = (PFNGLGETCOMPRESSEDTEXTUREIMAGEEXTPROC)load("glGetCompressedTextureImageEXT");
	glad_glCompressedMultiTexImage3DEXT = (PFNGLCOMPRESSEDMULTITEXIMAGE3DEXTPROC)load("glCompressedMultiTexImage3DEXT");
	glad_glCompressedMultiTexImage2DEXT = (PFNGLCOMPRESSEDMULTITEXIMAGE2DEXTPROC)load("glCompressedMultiTexImage2DEXT");
	glad_glCompressedMultiTexImage1DEXT = (PFNGLCOMPRESSEDMULTITEXIMAGE1DEXTPROC)load("glCompressedMultiTexImage1DEXT");
	glad_glCompressedMultiTexSubImage3DEXT = (PFNGLCOMPRESSEDMULTITEXSUBIMAGE3DEXTPROC)load("glCompressedMultiTexSubImage3DEXT");
	glad_glCompressedMultiTexSubImage2DEXT = (PFNGLCOMPRESSEDMULTITEXSUBIMAGE2DEXTPROC)load("glCompressedMultiTexSubImage2DEXT");
	glad_glCompressedMultiTexSubImage1DEXT = (PFNGLCOMPRESSEDMULTITEXSUBIMAGE1DEXTPROC)load("glCompressedMultiTexSubImage1DEXT");
	glad_glGetCompressedMultiTexImageEXT = (PFNGLGETCOMPRESSEDMULTITEXIMAGEEXTPROC)load("glGetCompressedMultiTexImageEXT");
	glad_glMatrixLoadTransposefEXT = (PFNGLMATRIXLOADTRANSPOSEFEXTPROC)load("glMatrixLoadTransposefEXT");
	glad_glMatrixLoadTransposedEXT = (PFNGLMATRIXLOADTRANSPOSEDEXTPROC)load("glMatrixLoadTransposedEXT");
	glad_glMatrixMultTransposefEXT = (PFNGLMATRIXMULTTRANSPOSEFEXTPROC)load("glMatrixMultTransposefEXT");
	glad_glMatrixMultTransposedEXT = (PFNGLMATRIXMULTTRANSPOSEDEXTPROC)load("glMatrixMultTransposedEXT");
	glad_glNamedBufferDataEXT = (PFNGLNAMEDBUFFERDATAEXTPROC)load("glNamedBufferDataEXT");
	glad_glNamedBufferSubDataEXT = (PFNGLNAMEDBUFFERSUBDATAEXTPROC)load("glNamedBufferSubDataEXT");
	glad_glMapNamedBufferEXT = (PFNGLMAPNAMEDBUFFEREXTPROC)load("glMapNamedBufferEXT");
	glad_glUnmapNamedBufferEXT = (PFNGLUNMAPNAMEDBUFFEREXTPROC)load("glUnmapNamedBufferEXT");
	glad_glGetNamedBufferParameterivEXT = (PFNGLGETNAMEDBUFFERPARAMETERIVEXTPROC)load("glGetNamedBufferParameterivEXT");
	glad_glGetNamedBufferPointervEXT = (PFNGLGETNAMEDBUFFERPOINTERVEXTPROC)load("glGetNamedBufferPointervEXT");
	glad_glGetNamedBufferSubDataEXT = (PFNGLGETNAMEDBUFFERSUBDATAEXTPROC)load("glGetNamedBufferSubDataEXT");
	glad_glProgramUniform1fEXT = (PFNGLPROGRAMUNIFORM1FEXTPROC)load("glProgramUniform1fEXT");
	glad_glProgramUniform2fEXT = (PFNGLPROGRAMUNIFORM2FEXTPROC)load("glProgramUniform2fEXT");
	glad_glProgramUniform3fEXT = (PFNGLPROGRAMUNIFORM3FEXTPROC)load("glProgramUniform3fEXT");
	glad_glProgramUniform4fEXT = (PFNGLPROGRAMUNIFORM4FEXTPROC)load("glProgramUniform4fEXT");
	glad_glProgramUniform1iEXT = (PFNGLPROGRAMUNIFORM1IEXTPROC)load("glProgramUniform1iEXT");
	glad_glProgramUniform2iEXT = (PFNGLPROGRAMUNIFORM2IEXTPROC)load("glProgramUniform2iEXT");
	glad_glProgramUniform3iEXT = (PFNGLPROGRAMUNIFORM3IEXTPROC)load("glProgramUniform3iEXT");
	glad_glProgramUniform4iEXT = (PFNGLPROGRAMUNIFORM4IEXTPROC)load("glProgramUniform4iEXT");
	glad_glProgramUniform1fvEXT = (PFNGLPROGRAMUNIFORM1FVEXTPROC)load("glProgramUniform1fvEXT");
	glad_glProgramUniform2fvEXT = (PFNGLPROGRAMUNIFORM2FVEXTPROC)load("glProgramUniform2fvEXT");
	glad_glProgramUniform3fvEXT = (PFNGLPROGRAMUNIFORM3FVEXTPROC)load("glProgramUniform3fvEXT");
	glad_glProgramUniform4fvEXT = (PFNGLPROGRAMUNIFORM4FVEXTPROC)load("glProgramUniform4fvEXT");
	glad_glProgramUniform1ivEXT = (PFNGLPROGRAMUNIFORM1IVEXTPROC)load("glProgramUniform1ivEXT");
	glad_glProgramUniform2ivEXT = (PFNGLPROGRAMUNIFORM2IVEXTPROC)load("glProgramUniform2ivEXT");
	glad_glProgramUniform3ivEXT = (PFNGLPROGRAMUNIFORM3IVEXTPROC)load("glProgramUniform3ivEXT");
	glad_glProgramUniform4ivEXT = (PFNGLPROGRAMUNIFORM4IVEXTPROC)load("glProgramUniform4ivEXT");
	glad_glProgramUniformMatrix2fvEXT = (PFNGLPROGRAMUNIFORMMATRIX2FVEXTPROC)load("glProgramUniformMatrix2fvEXT");
	glad_glProgramUniformMatrix3fvEXT = (PFNGLPROGRAMUNIFORMMATRIX3FVEXTPROC)load("glProgramUniformMatrix3fvEXT");
	glad_glProgramUniformMatrix4fvEXT = (PFNGLPROGRAMUNIFORMMATRIX4FVEXTPROC)load("glProgramUniformMatrix4fvEXT");
	glad_glProgramUniformMatrix2x3fvEXT = (PFNGLPROGRAMUNIFORMMATRIX2X3FVEXTPROC)load("glProgramUniformMatrix2x3fvEXT");
	glad_glProgramUniformMatrix3x2fvEXT = (PFNGLPROGRAMUNIFORMMATRIX3X2FVEXTPROC)load("glProgramUniformMatrix3x2fvEXT");
	glad_glProgramUniformMatrix2x4fvEXT = (PFNGLPROGRAMUNIFORMMATRIX2X4FVEXTPROC)load("glProgramUniformMatrix2x4fvEXT");
	glad_glProgramUniformMatrix4x2fvEXT = (PFNGLPROGRAMUNIFORMMATRIX4X2FVEXTPROC)load("glProgramUniformMatrix4x2fvEXT");
	glad_glProgramUniformMatrix3x4fvEXT = (PFNGLPROGRAMUNIFORMMATRIX3X4FVEXTPROC)load("glProgramUniformMatrix3x4fvEXT");
	glad_glProgramUniformMatrix4x3fvEXT = (PFNGLPROGRAMUNIFORMMATRIX4X3FVEXTPROC)load("glProgramUniformMatrix4x3fvEXT");
	glad_glTextureBufferEXT = (PFNGLTEXTUREBUFFEREXTPROC)load("glTextureBufferEXT");
	glad_glMultiTexBufferEXT = (PFNGLMULTITEXBUFFEREXTPROC)load("glMultiTexBufferEXT");
	glad_glTextureParameterIivEXT = (PFNGLTEXTUREPARAMETERIIVEXTPROC)load("glTextureParameterIivEXT");
	glad_glTextureParameterIuivEXT = (PFNGLTEXTUREPARAMETERIUIVEXTPROC)load("glTextureParameterIuivEXT");
	glad_glGetTextureParameterIivEXT = (PFNGLGETTEXTUREPARAMETERIIVEXTPROC)load("glGetTextureParameterIivEXT");
	glad_glGetTextureParameterIuivEXT = (PFNGLGETTEXTUREPARAMETERIUIVEXTPROC)load("glGetTextureParameterIuivEXT");
	glad_glMultiTexParameterIivEXT = (PFNGLMULTITEXPARAMETERIIVEXTPROC)load("glMultiTexParameterIivEXT");
	glad_glMultiTexParameterIuivEXT = (PFNGLMULTITEXPARAMETERIUIVEXTPROC)load("glMultiTexParameterIuivEXT");
	glad_glGetMultiTexParameterIivEXT = (PFNGLGETMULTITEXPARAMETERIIVEXTPROC)load("glGetMultiTexParameterIivEXT");
	glad_glGetMultiTexParameterIuivEXT = (PFNGLGETMULTITEXPARAMETERIUIVEXTPROC)load("glGetMultiTexParameterIuivEXT");
	glad_glProgramUniform1uiEXT = (PFNGLPROGRAMUNIFORM1UIEXTPROC)load("glProgramUniform1uiEXT");
	glad_glProgramUniform2uiEXT = (PFNGLPROGRAMUNIFORM2UIEXTPROC)load("glProgramUniform2uiEXT");
	glad_glProgramUniform3uiEXT = (PFNGLPROGRAMUNIFORM3UIEXTPROC)load("glProgramUniform3uiEXT");
	glad_glProgramUniform4uiEXT = (PFNGLPROGRAMUNIFORM4UIEXTPROC)load("glProgramUniform4uiEXT");
	glad_glProgramUniform1uivEXT = (PFNGLPROGRAMUNIFORM1UIVEXTPROC)load("glProgramUniform1uivEXT");
	glad_glProgramUniform2uivEXT = (PFNGLPROGRAMUNIFORM2UIVEXTPROC)load("glProgramUniform2uivEXT");
	glad_glProgramUniform3uivEXT = (PFNGLPROGRAMUNIFORM3UIVEXTPROC)load("glProgramUniform3uivEXT");
	glad_glProgramUniform4uivEXT = (PFNGLPROGRAMUNIFORM4UIVEXTPROC)load("glProgramUniform4uivEXT");
	glad_glNamedProgramLocalParameters4fvEXT = (PFNGLNAMEDPROGRAMLOCALPARAMETERS4FVEXTPROC)load("glNamedProgramLocalParameters4fvEXT");
	glad_glNamedProgramLocalParameterI4iEXT = (PFNGLNAMEDPROGRAMLOCALPARAMETERI4IEXTPROC)load("glNamedProgramLocalParameterI4iEXT");
	glad_glNamedProgramLocalParameterI4ivEXT = (PFNGLNAMEDPROGRAMLOCALPARAMETERI4IVEXTPROC)load("glNamedProgramLocalParameterI4ivEXT");
	glad_glNamedProgramLocalParametersI4ivEXT = (PFNGLNAMEDPROGRAMLOCALPARAMETERSI4IVEXTPROC)load("glNamedProgramLocalParametersI4ivEXT");
	glad_glNamedProgramLocalParameterI4uiEXT = (PFNGLNAMEDPROGRAMLOCALPARAMETERI4UIEXTPROC)load("glNamedProgramLocalParameterI4uiEXT");
	glad_glNamedProgramLocalParameterI4uivEXT = (PFNGLNAMEDPROGRAMLOCALPARAMETERI4UIVEXTPROC)load("glNamedProgramLocalParameterI4uivEXT");
	glad_glNamedProgramLocalParametersI4uivEXT = (PFNGLNAMEDPROGRAMLOCALPARAMETERSI4UIVEXTPROC)load("glNamedProgramLocalParametersI4uivEXT");
	glad_glGetNamedProgramLocalParameterIivEXT = (PFNGLGETNAMEDPROGRAMLOCALPARAMETERIIVEXTPROC)load("glGetNamedProgramLocalParameterIivEXT");
	glad_glGetNamedProgramLocalParameterIuivEXT = (PFNGLGETNAMEDPROGRAMLOCALPARAMETERIUIVEXTPROC)load("glGetNamedProgramLocalParameterIuivEXT");
	glad_glEnableClientStateiEXT = (PFNGLENABLECLIENTSTATEIEXTPROC)load("glEnableClientStateiEXT");
	glad_glDisableClientStateiEXT = (PFNGLDISABLECLIENTSTATEIEXTPROC)load("glDisableClientStateiEXT");
	glad_glGetFloati_vEXT = (PFNGLGETFLOATI_VEXTPROC)load("glGetFloati_vEXT");
	glad_glGetDoublei_vEXT = (PFNGLGETDOUBLEI_VEXTPROC)load("glGetDoublei_vEXT");
	glad_glGetPointeri_vEXT = (PFNGLGETPOINTERI_VEXTPROC)load("glGetPointeri_vEXT");
	glad_glNamedProgramStringEXT = (PFNGLNAMEDPROGRAMSTRINGEXTPROC)load("glNamedProgramStringEXT");
	glad_glNamedProgramLocalParameter4dEXT = (PFNGLNAMEDPROGRAMLOCALPARAMETER4DEXTPROC)load("glNamedProgramLocalParameter4dEXT");
	glad_glNamedProgramLocalParameter4dvEXT = (PFNGLNAMEDPROGRAMLOCALPARAMETER4DVEXTPROC)load("glNamedProgramLocalParameter4dvEXT");
	glad_glNamedProgramLocalParameter4fEXT = (PFNGLNAMEDPROGRAMLOCALPARAMETER4FEXTPROC)load("glNamedProgramLocalParameter4fEXT");
	glad_glNamedProgramLocalParameter4fvEXT = (PFNGLNAMEDPROGRAMLOCALPARAMETER4FVEXTPROC)load("glNamedProgramLocalParameter4fvEXT");
	glad_glGetNamedProgramLocalParameterdvEXT = (PFNGLGETNAMEDPROGRAMLOCALPARAMETERDVEXTPROC)load("glGetNamedProgramLocalParameterdvEXT");
	glad_glGetNamedProgramLocalParameterfvEXT = (PFNGLGETNAMEDPROGRAMLOCALPARAMETERFVEXTPROC)load("glGetNamedProgramLocalParameterfvEXT");
	glad_glGetNamedProgramivEXT = (PFNGLGETNAMEDPROGRAMIVEXTPROC)load("glGetNamedProgramivEXT");
	glad_glGetNamedProgramStringEXT = (PFNGLGETNAMEDPROGRAMSTRINGEXTPROC)load("glGetNamedProgramStringEXT");
	glad_glNamedRenderbufferStorageEXT = (PFNGLNAMEDRENDERBUFFERSTORAGEEXTPROC)load("glNamedRenderbufferStorageEXT");
	glad_glGetNamedRenderbufferParameterivEXT = (PFNGLGETNAMEDRENDERBUFFERPARAMETERIVEXTPROC)load("glGetNamedRenderbufferParameterivEXT");
	glad_glNamedRenderbufferStorageMultisampleEXT = (PFNGLNAMEDRENDERBUFFERSTORAGEMULTISAMPLEEXTPROC)load("glNamedRenderbufferStorageMultisampleEXT");
	glad_glNamedRenderbufferStorageMultisampleCoverageEXT = (PFNGLNAMEDRENDERBUFFERSTORAGEMULTISAMPLECOVERAGEEXTPROC)load("glNamedRenderbufferStorageMultisampleCoverageEXT");
	glad_glCheckNamedFramebufferStatusEXT = (PFNGLCHECKNAMEDFRAMEBUFFERSTATUSEXTPROC)load("glCheckNamedFramebufferStatusEXT");
	glad_glNamedFramebufferTexture1DEXT = (PFNGLNAMEDFRAMEBUFFERTEXTURE1DEXTPROC)load("glNamedFramebufferTexture1DEXT");
	glad_glNamedFramebufferTexture2DEXT = (PFNGLNAMEDFRAMEBUFFERTEXTURE2DEXTPROC)load("glNamedFramebufferTexture2DEXT");
	glad_glNamedFramebufferTexture3DEXT = (PFNGLNAMEDFRAMEBUFFERTEXTURE3DEXTPROC)load("glNamedFramebufferTexture3DEXT");
	glad_glNamedFramebufferRenderbufferEXT = (PFNGLNAMEDFRAMEBUFFERRENDERBUFFEREXTPROC)load("glNamedFramebufferRenderbufferEXT");
	glad_glGetNamedFramebufferAttachmentParameterivEXT = (PFNGLGETNAMEDFRAMEBUFFERATTACHMENTPARAMETERIVEXTPROC)load("glGetNamedFramebufferAttachmentParameterivEXT");
	glad_glGenerateTextureMipmapEXT = (PFNGLGENERATETEXTUREMIPMAPEXTPROC)load("glGenerateTextureMipmapEXT");
	glad_glGenerateMultiTexMipmapEXT = (PFNGLGENERATEMULTITEXMIPMAPEXTPROC)load("glGenerateMultiTexMipmapEXT");
	glad_glFramebufferDrawBufferEXT = (PFNGLFRAMEBUFFERDRAWBUFFEREXTPROC)load("glFramebufferDrawBufferEXT");
	glad_glFramebufferDrawBuffersEXT = (PFNGLFRAMEBUFFERDRAWBUFFERSEXTPROC)load("glFramebufferDrawBuffersEXT");
	glad_glFramebufferReadBufferEXT = (PFNGLFRAMEBUFFERREADBUFFEREXTPROC)load("glFramebufferReadBufferEXT");
	glad_glGetFramebufferParameterivEXT = (PFNGLGETFRAMEBUFFERPARAMETERIVEXTPROC)load("glGetFramebufferParameterivEXT");
	glad_glNamedCopyBufferSubDataEXT = (PFNGLNAMEDCOPYBUFFERSUBDATAEXTPROC)load("glNamedCopyBufferSubDataEXT");
	glad_glNamedFramebufferTextureEXT = (PFNGLNAMEDFRAMEBUFFERTEXTUREEXTPROC)load("glNamedFramebufferTextureEXT");
	glad_glNamedFramebufferTextureLayerEXT = (PFNGLNAMEDFRAMEBUFFERTEXTURELAYEREXTPROC)load("glNamedFramebufferTextureLayerEXT");
	glad_glNamedFramebufferTextureFaceEXT = (PFNGLNAMEDFRAMEBUFFERTEXTUREFACEEXTPROC)load("glNamedFramebufferTextureFaceEXT");
	glad_glTextureRenderbufferEXT = (PFNGLTEXTURERENDERBUFFEREXTPROC)load("glTextureRenderbufferEXT");
	glad_glMultiTexRenderbufferEXT = (PFNGLMULTITEXRENDERBUFFEREXTPROC)load("glMultiTexRenderbufferEXT");
	glad_glVertexArrayVertexOffsetEXT = (PFNGLVERTEXARRAYVERTEXOFFSETEXTPROC)load("glVertexArrayVertexOffsetEXT");
	glad_glVertexArrayColorOffsetEXT = (PFNGLVERTEXARRAYCOLOROFFSETEXTPROC)load("glVertexArrayColorOffsetEXT");
	glad_glVertexArrayEdgeFlagOffsetEXT = (PFNGLVERTEXARRAYEDGEFLAGOFFSETEXTPROC)load("glVertexArrayEdgeFlagOffsetEXT");
	glad_glVertexArrayIndexOffsetEXT = (PFNGLVERTEXARRAYINDEXOFFSETEXTPROC)load("glVertexArrayIndexOffsetEXT");
	glad_glVertexArrayNormalOffsetEXT = (PFNGLVERTEXARRAYNORMALOFFSETEXTPROC)load("glVertexArrayNormalOffsetEXT");
	glad_glVertexArrayTexCoordOffsetEXT = (PFNGLVERTEXARRAYTEXCOORDOFFSETEXTPROC)load("glVertexArrayTexCoordOffsetEXT");
	glad_glVertexArrayMultiTexCoordOffsetEXT = (PFNGLVERTEXARRAYMULTITEXCOORDOFFSETEXTPROC)load("glVertexArrayMultiTexCoordOffsetEXT");
	glad_glVertexArrayFogCoordOffsetEXT = (PFNGLVERTEXARRAYFOGCOORDOFFSETEXTPROC)load("glVertexArrayFogCoordOffsetEXT");
	glad_glVertexArraySecondaryColorOffsetEXT = (PFNGLVERTEXARRAYSECONDARYCOLOROFFSETEXTPROC)load("glVertexArraySecondaryColorOffsetEXT");
	glad_glVertexArrayVertexAttribOffsetEXT = (PFNGLVERTEXARRAYVERTEXATTRIBOFFSETEXTPROC)load("glVertexArrayVertexAttribOffsetEXT");
	glad_glVertexArrayVertexAttribIOffsetEXT = (PFNGLVERTEXARRAYVERTEXATTRIBIOFFSETEXTPROC)load("glVertexArrayVertexAttribIOffsetEXT");
	glad_glEnableVertexArrayEXT = (PFNGLENABLEVERTEXARRAYEXTPROC)load("glEnableVertexArrayEXT");
	glad_glDisableVertexArrayEXT = (PFNGLDISABLEVERTEXARRAYEXTPROC)load("glDisableVertexArrayEXT");
	glad_glEnableVertexArrayAttribEXT = (PFNGLENABLEVERTEXARRAYATTRIBEXTPROC)load("glEnableVertexArrayAttribEXT");
	glad_glDisableVertexArrayAttribEXT = (PFNGLDISABLEVERTEXARRAYATTRIBEXTPROC)load("glDisableVertexArrayAttribEXT");
	glad_glGetVertexArrayIntegervEXT = (PFNGLGETVERTEXARRAYINTEGERVEXTPROC)load("glGetVertexArrayIntegervEXT");
	glad_glGetVertexArrayPointervEXT = (PFNGLGETVERTEXARRAYPOINTERVEXTPROC)load("glGetVertexArrayPointervEXT");
	glad_glGetVertexArrayIntegeri_vEXT = (PFNGLGETVERTEXARRAYINTEGERI_VEXTPROC)load("glGetVertexArrayIntegeri_vEXT");
	glad_glGetVertexArrayPointeri_vEXT = (PFNGLGETVERTEXARRAYPOINTERI_VEXTPROC)load("glGetVertexArrayPointeri_vEXT");
	glad_glMapNamedBufferRangeEXT = (PFNGLMAPNAMEDBUFFERRANGEEXTPROC)load("glMapNamedBufferRangeEXT");
	glad_glFlushMappedNamedBufferRangeEXT = (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGEEXTPROC)load("glFlushMappedNamedBufferRangeEXT");
	glad_glNamedBufferStorageEXT = (PFNGLNAMEDBUFFERSTORAGEEXTPROC)load("glNamedBufferStorageEXT");
	glad_glClearNamedBufferDataEXT = (PFNGLCLEARNAMEDBUFFERDATAEXTPROC)load("glClearNamedBufferDataEXT");
	glad_glClearNamedBufferSubDataEXT = (PFNGLCLEARNAMEDBUFFERSUBDATAEXTPROC)load("glClearNamedBufferSubDataEXT");
	glad_glNamedFramebufferParameteriEXT = (PFNGLNAMEDFRAMEBUFFERPARAMETERIEXTPROC)load("glNamedFramebufferParameteriEXT");
	glad_glGetNamedFramebufferParameterivEXT = (PFNGLGETNAMEDFRAMEBUFFERPARAMETERIVEXTPROC)load("glGetNamedFramebufferParameterivEXT");
	glad_glProgramUniform1dEXT = (PFNGLPROGRAMUNIFORM1DEXTPROC)load("glProgramUniform1dEXT");
	glad_glProgramUniform2dEXT = (PFNGLPROGRAMUNIFORM2DEXTPROC)load("glProgramUniform2dEXT");
	glad_glProgramUniform3dEXT = (PFNGLPROGRAMUNIFORM3DEXTPROC)load("glProgramUniform3dEXT");
	glad_glProgramUniform4dEXT = (PFNGLPROGRAMUNIFORM4DEXTPROC)load("glProgramUniform4dEXT");
	glad_glProgramUniform1dvEXT = (PFNGLPROGRAMUNIFORM1DVEXTPROC)load("glProgramUniform1dvEXT");
	glad_glProgramUniform2dvEXT = (PFNGLPROGRAMUNIFORM2DVEXTPROC)load("glProgramUniform2dvEXT");
	glad_glProgramUniform3dvEXT = (PFNGLPROGRAMUNIFORM3DVEXTPROC)load("glProgramUniform3dvEXT");
	glad_glProgramUniform4dvEXT = (PFNGLPROGRAMUNIFORM4DVEXTPROC)load("glProgramUniform4dvEXT");
	glad_glProgramUniformMatrix2dvEXT = (PFNGLPROGRAMUNIFORMMATRIX2DVEXTPROC)load("glProgramUniformMatrix2dvEXT");
	glad_glProgramUniformMatrix3dvEXT = (PFNGLPROGRAMUNIFORMMATRIX3DVEXTPROC)load("glProgramUniformMatrix3dvEXT");
	glad_glProgramUniformMatrix4dvEXT = (PFNGLPROGRAMUNIFORMMATRIX4DVEXTPROC)load("glProgramUniformMatrix4dvEXT");
	glad_glProgramUniformMatrix2x3dvEXT = (PFNGLPROGRAMUNIFORMMATRIX2X3DVEXTPROC)load("glProgramUniformMatrix2x3dvEXT");
	glad_glProgramUniformMatrix2x4dvEXT = (PFNGLPROGRAMUNIFORMMATRIX2X4DVEXTPROC)load("glProgramUniformMatrix2x4dvEXT");
	glad_glProgramUniformMatrix3x2dvEXT = (PFNGLPROGRAMUNIFORMMATRIX3X2DVEXTPROC)load("glProgramUniformMatrix3x2dvEXT");
	glad_glProgramUniformMatrix3x4dvEXT = (PFNGLPROGRAMUNIFORMMATRIX3X4DVEXTPROC)load("glProgramUniformMatrix3x4dvEXT");
	glad_glProgramUniformMatrix4x2dvEXT = (PFNGLPROGRAMUNIFORMMATRIX4X2DVEXTPROC)load("glProgramUniformMatrix4x2dvEXT");
	glad_glProgramUniformMatrix4x3dvEXT = (PFNGLPROGRAMUNIFORMMATRIX4X3DVEXTPROC)load("glProgramUniformMatrix4x3dvEXT");
	glad_glTextureBufferRangeEXT = (PFNGLTEXTUREBUFFERRANGEEXTPROC)load("glTextureBufferRangeEXT");
	glad_glTextureStorage1DEXT = (PFNGLTEXTURESTORAGE1DEXTPROC)load("glTextureStorage1DEXT");
	glad_glTextureStorage2DEXT = (PFNGLTEXTURESTORAGE2DEXTPROC)load("glTextureStorage2DEXT");
	glad_glTextureStorage3DEXT = (PFNGLTEXTURESTORAGE3DEXTPROC)load("glTextureStorage3DEXT");
	glad_glTextureStorage2DMultisampleEXT = (PFNGLTEXTURESTORAGE2DMULTISAMPLEEXTPROC)load("glTextureStorage2DMultisampleEXT");
	glad_glTextureStorage3DMultisampleEXT = (PFNGLTEXTURESTORAGE3DMULTISAMPLEEXTPROC)load("glTextureStorage3DMultisampleEXT");
	glad_glVertexArrayBindVertexBufferEXT = (PFNGLVERTEXARRAYBINDVERTEXBUFFEREXTPROC)load("glVertexArrayBindVertexBufferEXT");
	glad_glVertexArrayVertexAttribFormatEXT = (PFNGLVERTEXARRAYVERTEXATTRIBFORMATEXTPROC)load("glVertexArrayVertexAttribFormatEXT");
	glad_glVertexArrayVertexAttribIFormatEXT = (PFNGLVERTEXARRAYVERTEXATTRIBIFORMATEXTPROC)load("glVertexArrayVertexAttribIFormatEXT");
	glad_glVertexArrayVertexAttribLFormatEXT = (PFNGLVERTEXARRAYVERTEXATTRIBLFORMATEXTPROC)load("glVertexArrayVertexAttribLFormatEXT");
	glad_glVertexArrayVertexAttribBindingEXT = (PFNGLVERTEXARRAYVERTEXATTRIBBINDINGEXTPROC)load("glVertexArrayVertexAttribBindingEXT");
	glad_glVertexArrayVertexBindingDivisorEXT = (PFNGLVERTEXARRAYVERTEXBINDINGDIVISOREXTPROC)load("glVertexArrayVertexBindingDivisorEXT");
	glad_glVertexArrayVertexAttribLOffsetEXT = (PFNGLVERTEXARRAYVERTEXATTRIBLOFFSETEXTPROC)load("glVertexArrayVertexAttribLOffsetEXT");
	glad_glTexturePageCommitmentEXT = (PFNGLTEXTUREPAGECOMMITMENTEXTPROC)load("glTexturePageCommitmentEXT");
	glad_glVertexArrayVertexAttribDivisorEXT = (PFNGLVERTEXARRAYVERTEXATTRIBDIVISOREXTPROC)load("glVertexArrayVertexAttribDivisorEXT");
}